

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

void __thiscall CDT::train(CDT *this)

{
  ostream *poVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  Shape SVar5;
  uint uStack_7c;
  uint local_74;
  uint i_1;
  uint uStack_5c;
  uint local_54;
  uint i;
  Shape local_3c;
  Shape local_30;
  Shape local_20;
  CDT *local_10;
  CDT *this_local;
  
  local_10 = this;
  std::operator<<((ostream *)&std::cout,"Training..\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Input shape: ");
  SVar5 = Matrix<double>::shape(&this->m_input);
  local_30._0_8_ = SVar5._0_8_;
  local_30.is_diogonal = SVar5.is_diogonal;
  local_20._0_8_ = local_30._0_8_;
  local_20.is_diogonal = local_30.is_diogonal;
  poVar1 = operator<<(poVar1,&local_20);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Output shape: ");
  SVar5 = Matrix<double>::shape(&this->m_output);
  local_3c._0_8_ = SVar5._0_8_;
  local_3c.is_diogonal = SVar5.is_diogonal;
  poVar1 = operator<<(poVar1,&local_3c);
  std::operator<<(poVar1,'\n');
  std::operator<<((ostream *)&std::cout,"Initial weights: ");
  local_54 = 0;
  while( true ) {
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    SVar5 = Matrix<double>::shape(&pvVar2->m_weights);
    uStack_5c = SVar5.n_col;
    if (uStack_5c <= local_54) break;
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar3 = Matrix<double>::operator[](&pvVar2->m_weights,0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(ulong)local_54);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
    std::operator<<(poVar1," ");
    local_54 = local_54 + 1;
  }
  std::operator<<((ostream *)&std::cout,'\n');
  adjust_weights(this);
  adjust_activation(this);
  std::operator<<((ostream *)&std::cout,"Updated weights: ");
  local_74 = 0;
  while( true ) {
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    SVar5 = Matrix<double>::shape(&pvVar2->m_weights);
    uStack_7c = SVar5.n_col;
    if (uStack_7c <= local_74) break;
    pvVar2 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
    pvVar3 = Matrix<double>::operator[](&pvVar2->m_weights,0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar3,(ulong)local_74);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
    std::operator<<(poVar1," ");
    local_74 = local_74 + 1;
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void CDT::train(){
    std::cout<<"Training..\n";
    std::cout<<"Input shape: "<<m_input.shape()<<'\n';
    std::cout<<"Output shape: "<<m_output.shape()<<'\n';

    std::cout<<"Initial weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<" ";
    }   std::cout<<'\n';

    adjust_weights();
    adjust_activation();

    std::cout<<"Updated weights: ";
    for(unsigned i=0;i<m_layers[0].m_weights.shape().n_col;++i){
        std::cout<<m_layers[0].m_weights[0][i]<<" ";
    }   std::cout<<'\n';
}